

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::NumberTrio>
          (BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,NumberTrio *key)

{
  Type piVar1;
  Type pSVar2;
  bool bVar3;
  hash_t hVar4;
  uint uVar5;
  hash_t extraout_EDX;
  hash_t extraout_EDX_00;
  Type this_00;
  int iVar6;
  DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  *pDVar7;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar5 = 0;
  }
  else {
    hVar4 = GetHashCodeWithKey<Js::NumberTrio>(key);
    uVar5 = GetBucket(this,hVar4);
    pSVar2 = this->entries;
    pDVar7 = (DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              *)(piVar1 + uVar5);
    uVar5 = 0;
    hVar4 = extraout_EDX;
    while( true ) {
      iVar6 = *(int *)pDVar7;
      if ((long)iVar6 < 0) break;
      bVar3 = DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ::KeyEquals<DefaultComparer<Js::NumberTrio>,Js::NumberTrio>
                        ((DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          *)(pSVar2 + iVar6),key,hVar4);
      if (bVar3) {
        this_00 = this->stats;
        goto LAB_0021aa21;
      }
      uVar5 = uVar5 + 1;
      pDVar7 = (DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                *)(pSVar2 + iVar6) + 0xc;
      hVar4 = extraout_EDX_00;
    }
  }
  this_00 = this->stats;
  iVar6 = -1;
LAB_0021aa21:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar5);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }